

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

uint32_t read_filter_data(rar5 *rar,uint32_t offset)

{
  size_t __n;
  uint8_t *__src;
  ulong uVar1;
  uint32_t *__dest;
  uint uVar2;
  long lVar3;
  uint8_t linear_buf [4];
  uint32_t local_1c;
  
  __src = (rar->cstate).window_buf;
  lVar3 = (rar->cstate).window_mask;
  uVar2 = (uint)lVar3;
  uVar1 = (ulong)(uVar2 & offset);
  __n = (size_t)(uVar2 & offset + 4);
  if (__n < uVar1) {
    lVar3 = lVar3 - uVar1;
    memcpy(&local_1c,__src + uVar1,lVar3 + 1);
    __dest = (uint32_t *)((long)&local_1c + lVar3 + 1);
  }
  else {
    __n = (ulong)(offset + 4) - (ulong)offset;
    __src = __src + uVar1;
    __dest = &local_1c;
  }
  memcpy(__dest,__src,__n);
  return local_1c;
}

Assistant:

static uint32_t read_filter_data(struct rar5* rar, uint32_t offset) {
	uint8_t linear_buf[4];
	circular_memcpy(linear_buf, rar->cstate.window_buf,
	    rar->cstate.window_mask, offset, offset + 4);
	return archive_le32dec(linear_buf);
}